

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

void __thiscall
arangodb::velocypack::Validator::validateArray(Validator *this,uint8_t *ptr,size_t length)

{
  byte bVar1;
  byte *in_RSI;
  uint8_t head;
  uint8_t *in_stack_00000028;
  Validator *in_stack_00000030;
  size_t in_stack_00000060;
  uint8_t *in_stack_00000068;
  Validator *in_stack_00000070;
  size_t in_stack_00000080;
  uint8_t *in_stack_00000088;
  Validator *in_stack_00000090;
  
  bVar1 = *in_RSI;
  if (bVar1 == 0x13) {
    validateCompactArray(in_stack_00000030,in_stack_00000028,(size_t)this);
  }
  else if ((bVar1 < 2) || (5 < bVar1)) {
    if ((5 < bVar1) && (bVar1 < 10)) {
      validateIndexedArray(in_stack_00000090,in_stack_00000088,in_stack_00000080);
    }
  }
  else {
    validateUnindexedArray(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  }
  return;
}

Assistant:

void Validator::validateArray(uint8_t const* ptr, std::size_t length) {
  uint8_t head = *ptr;

  if (head == 0x13U) {
    // compact array
    validateCompactArray(ptr, length);
  } else if (head >= 0x02U && head <= 0x05U) {
    // array without index table
    validateUnindexedArray(ptr, length);
  } else if (head >= 0x06U && head <= 0x09U) {
    // array with index table
    validateIndexedArray(ptr, length);
  } else if (head == 0x01U) {
    // empty array. always valid
  }
}